

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O1

int Priority(expr_node *node)

{
  int iVar1;
  
  iVar1 = 1;
  if (node->type == '\x05') {
    iVar1 = 3;
    if ((node->value).integer - 1U < 5) {
      iVar1 = *(int *)(_ZL8splashes_rel + (node->value).integer * 4 + 0x18);
    }
  }
  return iVar1;
}

Assistant:

int Priority(const expr_node& node)
{
    if (node.type == OP) {
    switch (node.value.integer) {
        case PWR:
            return 2;
        
        case MUL:
        case DIV:
            return 4;
        
        case ADD:
        case SUB:
            return 5;
        
        default:
            return 3;
        }
    } else {
        return 1;
    }
}